

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvc.cpp
# Opt level: O0

int __thiscall VvcSliceHeader::deserialize(VvcSliceHeader *this,VvcSpsUnit *sps,VvcPpsUnit *pps)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  VodCoreException *e;
  bool ph_gdr_or_irap_pic_flag;
  int rez;
  VvcPpsUnit *pps_local;
  VvcSpsUnit *sps_local;
  VvcSliceHeader *this_local;
  
  this_local._4_4_ = VvcUnit::deserialize(&this->super_VvcUnit);
  if (this_local._4_4_ == 0) {
    bVar1 = BitStreamReader::getBit(&(this->super_VvcUnit).m_reader);
    if (bVar1) {
      bVar1 = BitStreamReader::getBit(&(this->super_VvcUnit).m_reader);
      BitStreamReader::skipBit(&(this->super_VvcUnit).m_reader);
      if (bVar1) {
        BitStreamReader::skipBit(&(this->super_VvcUnit).m_reader);
      }
      bVar1 = BitStreamReader::getBit(&(this->super_VvcUnit).m_reader);
      if (bVar1) {
        BitStreamReader::skipBit(&(this->super_VvcUnit).m_reader);
      }
      uVar3 = VvcUnit::extractUEGolombCode(&this->super_VvcUnit);
      if (0x3f < uVar3) {
        return 1;
      }
      uVar2 = BitStreamReader::getBits<unsigned_short>
                        (&(this->super_VvcUnit).m_reader,(uint)sps->log2_max_pic_order_cnt_lsb);
      this->pic_order_cnt_lsb = uVar2;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int VvcSliceHeader::deserialize(const VvcSpsUnit* sps, const VvcPpsUnit* pps)
{
    const int rez = VvcUnit::deserialize();
    if (rez)
        return rez;

    try
    {
        if (m_reader.getBit())  // sh_picture_header_in_slice_header_flag
        {
            const bool ph_gdr_or_irap_pic_flag = m_reader.getBit();
            m_reader.skipBit();  // ph_non_ref_pic_flag
            if (ph_gdr_or_irap_pic_flag)
                m_reader.skipBit();          // ph_gdr_pic_flag
            if (m_reader.getBit())           // ph_inter_slice_allowed_flag
                m_reader.skipBit();          // ph_intra_slice_allowed_flag
            if (extractUEGolombCode() > 63)  // ph_pps_id
                return 1;
            pic_order_cnt_lsb = m_reader.getBits<uint16_t>(sps->log2_max_pic_order_cnt_lsb);
        }

        return 0;
    }
    catch (VodCoreException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}